

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::InternalSwap
          (RepeatedField<unsigned_int> *this,RepeatedField<unsigned_int> *other)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  LogMessage *other_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (this == other) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    other_00 = internal::LogMessage::operator<<(&local_50,"CHECK failed: this != other: ");
    internal::LogFinisher::operator=(&local_51,other_00);
    internal::LogMessage::~LogMessage(&local_50);
  }
  iVar4 = this->current_size_;
  iVar5 = this->total_size_;
  pvVar1 = this->arena_or_elements_;
  iVar3 = other->total_size_;
  pvVar2 = other->arena_or_elements_;
  this->current_size_ = other->current_size_;
  this->total_size_ = iVar3;
  this->arena_or_elements_ = pvVar2;
  other->current_size_ = iVar4;
  other->total_size_ = iVar5;
  other->arena_or_elements_ = pvVar1;
  return;
}

Assistant:

inline void RepeatedField<Element>::InternalSwap(RepeatedField* other) {
  GOOGLE_DCHECK(this != other);

  // Swap all fields at once.
  static_assert(std::is_standard_layout<RepeatedField<Element>>::value,
                "offsetof() requires standard layout before c++17");
  internal::memswap<offsetof(RepeatedField, arena_or_elements_) +
                    sizeof(this->arena_or_elements_) -
                    offsetof(RepeatedField, current_size_)>(
      reinterpret_cast<char*>(this) + offsetof(RepeatedField, current_size_),
      reinterpret_cast<char*>(other) + offsetof(RepeatedField, current_size_));
}